

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

void __thiscall
gl4cts::BufferTextureStorageTestCase::BufferTextureStorageTestCase
          (BufferTextureStorageTestCase *this,Functions *gl,Context *context,
          TestContext *testContext,GLint page_size)

{
  bool bVar1;
  ContextType ctxType;
  ApiType requiredApiType;
  ContextInfo *this_00;
  RenderContext *pRVar2;
  RenderContext *render_context;
  ContextInfo *context_info;
  GLint page_size_local;
  TestContext *testContext_local;
  Context *context_local;
  Functions *gl_local;
  BufferTextureStorageTestCase *this_local;
  
  BufferStorageTestCase::BufferStorageTestCase(&this->super_BufferStorageTestCase);
  (this->super_BufferStorageTestCase)._vptr_BufferStorageTestCase =
       (_func_int **)&PTR__BufferTextureStorageTestCase_0323c8f0;
  this->m_gl = gl;
  this->m_helper_bo = 0;
  this->m_helper_bo_data = (uchar *)0x0;
  this->m_helper_bo_data_size = 0;
  this->m_is_texture_buffer_range_supported = false;
  this->m_page_size = page_size;
  this->m_po = 0;
  this->m_po_local_wg_size = 0x400;
  this->m_sparse_bo = 0;
  this->m_sparse_bo_size = 0;
  this->m_sparse_bo_size_rounded = 0;
  this->m_ssbo = 0;
  this->m_ssbo_zero_data = (uchar *)0x0;
  this->m_ssbo_zero_data_size = 0;
  this->m_testCtx = testContext;
  this->m_to = 0;
  this->m_to_width = 0x10000;
  this_00 = deqp::Context::getContextInfo(context);
  pRVar2 = deqp::Context::getRenderContext(context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,3);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  if ((bVar1) ||
     (bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_texture_buffer_range"), bVar1))
  {
    this->m_is_texture_buffer_range_supported = true;
  }
  return;
}

Assistant:

BufferTextureStorageTestCase::BufferTextureStorageTestCase(const glw::Functions& gl, deqp::Context& context,
														   tcu::TestContext& testContext, glw::GLint page_size)
	: m_gl(gl)
	, m_helper_bo(0)
	, m_helper_bo_data(DE_NULL)
	, m_helper_bo_data_size(0)
	, m_is_texture_buffer_range_supported(false)
	, m_page_size(page_size)
	, m_po(0)
	, m_po_local_wg_size(1024)
	, m_sparse_bo(0)
	, m_sparse_bo_size(0)
	, m_sparse_bo_size_rounded(0)
	, m_ssbo(0)
	, m_ssbo_zero_data(DE_NULL)
	, m_ssbo_zero_data_size(0)
	, m_testCtx(testContext)
	, m_to(0)
	, m_to_width(65536) /* min max for GL_MAX_TEXTURE_BUFFER_SIZE_ARB */
{
	const glu::ContextInfo& context_info   = context.getContextInfo();
	glu::RenderContext&		render_context = context.getRenderContext();

	if (glu::contextSupports(render_context.getType(), glu::ApiType::core(4, 3)) ||
		context_info.isExtensionSupported("GL_ARB_texture_buffer_range"))
	{
		m_is_texture_buffer_range_supported = true;
	}
}